

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcSymObjBase::add_sc_name_entry(CTcSymObjBase *this,char *txt,size_t len)

{
  CTPNSuperclass *pCVar1;
  CTPNSuperclass **ppCVar2;
  
  pCVar1 = (CTPNSuperclass *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)txt);
  (pCVar1->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_0034d578;
  pCVar1->sym_txt_ = txt;
  pCVar1->sym_len_ = len;
  pCVar1->nxt_ = (CTPNSuperclass *)0x0;
  pCVar1->prv_ = (CTPNSuperclass *)0x0;
  pCVar1->sym_ = (CTcSymbol *)0x0;
  ppCVar2 = &this->sc_name_tail_->nxt_;
  if (this->sc_name_tail_ == (CTPNSuperclass *)0x0) {
    ppCVar2 = &this->sc_name_head_;
  }
  *ppCVar2 = pCVar1;
  this->sc_name_tail_ = pCVar1;
  return;
}

Assistant:

void CTcSymObjBase::add_sc_name_entry(const char *txt, size_t len)
{
    /* create the entry object */
    CTPNSuperclass *entry = new CTPNSuperclass(txt, len);

    /* link it into our list */
    if (sc_name_tail_ != 0)
        sc_name_tail_->nxt_ = entry;
    else
        sc_name_head_ = entry;
    sc_name_tail_ = entry;
}